

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicInputCase5::Run(BasicInputCase5 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint GVar3;
  GLuint i_1;
  GLubyte d [4];
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  GVar3 = 0;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,GVar3,0.0,0.0,0.0,0.0);
    GVar3 = GVar3 + 1;
  } while (GVar3 != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  GVar3 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0xe8,(void *)0x0,0x88e4);
  local_48 = CONCAT44(local_48._4_4_,0x7fff00);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,4,&local_48);
  local_48 = 0x7fffffff0000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,4,8,&local_48);
  local_48 = 0xffffffff00000000;
  uStack_40 = 0x7fffffff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0x10,&local_48);
  local_48 = CONCAT44(local_48._4_4_,0x7f8100);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x1c,4,&local_48);
  local_48 = 0x7fff80010000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,8,&local_48);
  local_48 = 0x8000000100000000;
  uStack_40 = 0x7fffffff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x28,0x10,&local_48);
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x40000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x38,0x10,&local_48);
  local_48._0_6_ = CONCAT42(0x4d004900,(undefined2)local_48);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x48,8,&local_48);
  local_48._0_4_ = 0xff7f3f00;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x68,4,&local_48);
  local_48._0_4_ = 0x5ffffc00;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x6c,4,&local_48);
  local_48._0_4_ = 0xff7fc00;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x70,4,&local_48);
  local_48 = CONCAT44(local_48._4_4_,0x7fffff);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x74,4,&local_48);
  local_48 = 0x7fffffffffff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x78,8,&local_48);
  local_48 = 0xffffffffffffffff;
  uStack_40 = 0x7fffffff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x80,0x10,&local_48);
  local_48 = CONCAT44(local_48._4_4_,0x7f817f);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x90,4,&local_48);
  local_48 = 0x7fff80017fff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x94,8,&local_48);
  local_48 = 0x800000017fffffff;
  uStack_40 = 0x7fffffff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x9c,0x10,&local_48);
  local_48 = 0x4040000000000000;
  uStack_40 = 0x40800000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xac,0x10,&local_48);
  local_48._0_6_ = CONCAT42(0x51004f80,(undefined2)local_48);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xbc,8,&local_48);
  local_48._0_4_ = 0x3f7fff;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xdc,4,&local_48);
  local_48._0_4_ = 0x9ffffc00;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xe0,4,&local_48);
  local_48 = CONCAT44(local_48._4_4_,0xcff7fe01);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xe4,4,&local_48);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1401,'\x01',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,4,0x1403,'\x01',4);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,4,0x1405,'\x01',0xc);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,3,4,0x1400,'\x01',0x1c);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,4,4,0x1402,'\x01',0x20);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,5,4,0x1404,'\x01',0x28);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,6,4,0x1406,'\x01',0x38);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,7,4,0x140b,'\x01',0x48);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,8,4,0x1401,'\x01',0x68);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,9,4,0x8368,'\x01',0x6c);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,10,4,0x8368,'\x01',0x6c);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0xb,4,0x8d9f,'\x01',0x70);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0xc,4,0x8d9f,'\x01',0x70);
  do {
    glu::CallLogWrapper::glVertexAttribBinding(this_00,GVar3,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,GVar3);
    GVar3 = GVar3 + 1;
  } while (GVar3 != 0xd);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x74);
  (this->super_BasicInputBase).expected_data[0].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = 0.5;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[1].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[1].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[1].m_data[2] = 0.5;
  pVVar1[1].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 0.5;
  pVVar1[2].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[3].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[3].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[3].m_data[2] = 1.0;
  pVVar1[3].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[4].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[4].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[4].m_data[2] = 1.0;
  pVVar1[4].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[5].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[5].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[5].m_data[2] = 1.0;
  pVVar1[5].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[6].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[6].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[6].m_data[2] = 2.0;
  pVVar1[6].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[7].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[7].m_data[1] = 10.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[7].m_data[2] = 20.0;
  pVVar1[7].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[8].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[8].m_data[1] = 0.25;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[8].m_data[2] = 0.5;
  pVVar1[8].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[9].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[9].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[9].m_data[2] = 0.5;
  pVVar1[9].m_data[3] = 0.33;
  (this->super_BasicInputBase).expected_data[10].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[10].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[10].m_data[2] = 0.5;
  pVVar1[10].m_data[3] = 0.33;
  (this->super_BasicInputBase).expected_data[0xb].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0xb].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xb].m_data[2] = 0.5;
  pVVar1[0xb].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0xc].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0xc].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xc].m_data[2] = 0.5;
  pVVar1[0xc].m_data[3] = 0.0;
  *(undefined1 **)(this->super_BasicInputBase).expected_data[0xf].m_data = &DAT_3f8000003f800000;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xf].m_data[2] = 0.5;
  pVVar1[0xf].m_data[3] = 0.0;
  *(undefined1 **)(this->super_BasicInputBase).expected_data[0x10].m_data = &DAT_3f8000003f800000;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 0.5;
  pVVar1[0x10].m_data[3] = 0.0;
  *(undefined1 **)(this->super_BasicInputBase).expected_data[0x11].m_data = &DAT_3f8000003f800000;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x11].m_data[2] = 0.5;
  pVVar1[0x11].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x12].m_data[2] = 1.0;
  pVVar1[0x12].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x13].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0x13].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x13].m_data[2] = 1.0;
  pVVar1[0x13].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x14].m_data[2] = 1.0;
  pVVar1[0x14].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x15].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0x15].m_data[1] = 3.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x15].m_data[2] = 4.0;
  pVVar1[0x15].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x16].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0x16].m_data[1] = 30.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x16].m_data[2] = 40.0;
  pVVar1[0x16].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x17].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0x17].m_data[1] = 0.5;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x17].m_data[2] = 0.25;
  pVVar1[0x17].m_data[3] = 0.0;
  (this->super_BasicInputBase).expected_data[0x18].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0x18].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x18].m_data[2] = 0.5;
  pVVar1[0x18].m_data[3] = 0.66;
  (this->super_BasicInputBase).expected_data[0x19].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0x19].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x19].m_data[2] = 0.5;
  pVVar1[0x19].m_data[3] = 0.66;
  (this->super_BasicInputBase).expected_data[0x1a].m_data[0] = -1.0;
  (this->super_BasicInputBase).expected_data[0x1a].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x1a].m_data[2] = 0.5;
  pVVar1[0x1a].m_data[3] = -1.0;
  (this->super_BasicInputBase).expected_data[0x1b].m_data[0] = -1.0;
  (this->super_BasicInputBase).expected_data[0x1b].m_data[1] = 1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x1b].m_data[2] = 0.5;
  pVVar1[0x1b].m_data[3] = -1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		const int kStride = 116;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, kStride * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLubyte d[] = { 0, 0xff, 0xff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 0, 0xffff, 0xffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 0, 0xffffffff, 0xffffffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { 0, -127, 127, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 0, -32767, 32767, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 0, -2147483647, 2147483647, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 40, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { 0, 1.0f, 2.0f, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 56, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(0.0), FloatToHalf(10.0), FloatToHalf(20.0), FloatToHalf(0.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 0, 0xff / 4, 0xff / 2, 0xff };
			glBufferSubData(GL_ARRAY_BUFFER, 104, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (1023 << 10) | (511 << 20) | (1 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 108, sizeof(d), &d);
		}
		/* */
		{
			GLint d = 0 | (511 << 10) | (255 << 20) | (0 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 112, sizeof(d), &d);
		}

		/* */
		{
			GLubyte d[] = { 0xff, 0xff, 0xff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 0xffff, 0xffff, 0xffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 0xffffffff, 0xffffffff, 0xffffffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { 127, -127, 127, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 28 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 32767, -32767, 32767, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 32 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 2147483647, -2147483647, 2147483647, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 40 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { 0, 3.0f, 4.0f, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 56 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(0.0), FloatToHalf(30.0), FloatToHalf(40.0), FloatToHalf(0.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 0xff, 0xff / 2, 0xff / 4, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 104 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (1023 << 10) | (511 << 20) | (2u << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 108 + kStride, sizeof(d), &d);
		}
		/* */
		{
			GLint d = (-511 & 0x3ff) | (511 << 10) | (255 << 20) | 3 << 30;
			glBufferSubData(GL_ARRAY_BUFFER, 112 + kStride, sizeof(d), &d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0);
		glVertexAttribFormat(1, 4, GL_UNSIGNED_SHORT, GL_TRUE, 4);
		glVertexAttribFormat(2, 4, GL_UNSIGNED_INT, GL_TRUE, 12);
		glVertexAttribFormat(3, 4, GL_BYTE, GL_TRUE, 28);
		glVertexAttribFormat(4, 4, GL_SHORT, GL_TRUE, 32);
		glVertexAttribFormat(5, 4, GL_INT, GL_TRUE, 40);
		glVertexAttribFormat(6, 4, GL_FLOAT, GL_TRUE, 56);
		glVertexAttribFormat(7, 4, GL_HALF_FLOAT, GL_TRUE, 72);
		glVertexAttribFormat(8, 4, GL_UNSIGNED_BYTE, GL_TRUE, 104);
		glVertexAttribFormat(9, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 108);
		glVertexAttribFormat(10, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 108);
		glVertexAttribFormat(11, 4, GL_INT_2_10_10_10_REV, GL_TRUE, 112);
		glVertexAttribFormat(12, 4, GL_INT_2_10_10_10_REV, GL_TRUE, 112);
		for (GLuint i = 0; i < 13; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexBuffer(0, m_vbo, 0, kStride);

		expected_data[0]	   = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[1]	   = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[2]	   = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[3]	   = Vec4(0.0f, -1.0f, 1.0f, 0.0f);
		expected_data[4]	   = Vec4(0.0f, -1.0f, 1.0f, 0.0f);
		expected_data[5]	   = Vec4(0.0f, -1.0f, 1.0f, 0.0f);
		expected_data[6]	   = Vec4(0.0f, 1.0f, 2.0f, 0.0f);
		expected_data[7]	   = Vec4(0.0f, 10.0f, 20.0f, 0.0f);
		expected_data[8]	   = Vec4(0.0f, 0.25f, 0.5f, 1.0f);
		expected_data[9]	   = Vec4(0.0f, 1.0f, 0.5f, 0.33f);
		expected_data[10]	  = Vec4(0.0f, 1.0f, 0.5f, 0.33f);
		expected_data[11]	  = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[12]	  = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[0 + 15]  = Vec4(1.0f, 1.0f, 0.5f, 0.0f);
		expected_data[1 + 15]  = Vec4(1.0f, 1.0f, 0.5f, 0.0f);
		expected_data[2 + 15]  = Vec4(1.0f, 1.0f, 0.5f, 0.0f);
		expected_data[3 + 15]  = Vec4(1.0f, -1.0f, 1.0f, 0.0f);
		expected_data[4 + 15]  = Vec4(1.0f, -1.0f, 1.0f, 0.0f);
		expected_data[5 + 15]  = Vec4(1.0f, -1.0f, 1.0f, 0.0f);
		expected_data[6 + 15]  = Vec4(0.0f, 3.0f, 4.0f, 0.0f);
		expected_data[7 + 15]  = Vec4(0.0f, 30.0f, 40.0f, 0.0f);
		expected_data[8 + 15]  = Vec4(1.0f, 0.5f, 0.25f, 0.0f);
		expected_data[9 + 15]  = Vec4(0.0f, 1.0f, 0.5f, 0.66f);
		expected_data[10 + 15] = Vec4(0.0f, 1.0f, 0.5f, 0.66f);
		expected_data[11 + 15] = Vec4(-1.0f, 1.0f, 0.5f, -1.0f);
		expected_data[12 + 15] = Vec4(-1.0f, 1.0f, 0.5f, -1.0f);
		return BasicInputBase::Run();
	}